

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long lVar1;
  ulong uVar2;
  sysbvm_tuple_t *psVar3;
  size_t sVar4;
  ulong *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  sysbvm_tuple_t sVar9;
  sysbvm_tuple_t slotCount;
  bool bVar10;
  bool bVar11;
  sysbvm_tuple_t *local_a8;
  ulong uStack_a0;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  sStack_90 = 0;
  local_a8 = (sysbvm_tuple_t *)0x0;
  uStack_a0 = 0;
  local_68 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 9;
  local_40 = (undefined1 *)&local_a8;
  sysbvm_stackFrame_pushRecord(&local_58);
  uVar7 = *(ulong *)(*arguments + 0x30);
  if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
    slotCount = (sysbvm_tuple_t)(*(uint *)(uVar7 + 0xc) >> 3);
  }
  else {
    slotCount = 0;
  }
  psVar3 = (sysbvm_tuple_t *)
           sysbvm_functionBytecodeDirectCompiler_compileASTNode
                     (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                      *(sysbvm_tuple_t *)(*arguments + 0x28));
  lVar1 = *(long *)(arguments[1] + 0x10);
  uVar7 = (ulong)psVar3 & 0xf;
  local_a8 = psVar3;
  if (uVar7 == 0 && psVar3 != (sysbvm_tuple_t *)0x0) {
    sVar9 = *psVar3;
  }
  else if ((int)uVar7 == 0xf) {
    sVar9 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psVar3 >> 4);
  }
  else {
    sVar9 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar7);
  }
  if ((sVar9 == (context->roots).functionBytecodeAssemblerVectorOperand) &&
     ((psVar3[2] & 0x80000) == 0 && ((uint)psVar3[3] & 0xffff0) == 0x20)) {
    uVar7 = (ulong)((uint)psVar3[2] >> 4 & 0x7fff);
    sVar4 = sysbvm_orderedCollection_getSize(*(sysbvm_tuple_t *)(lVar1 + 0x20));
    if ((uVar7 < sVar4) &&
       (((puVar5 = (ulong *)sysbvm_orderedCollection_at(*(sysbvm_tuple_t *)(lVar1 + 0x20),uVar7),
         ((ulong)puVar5 & 0xf) == 0 && puVar5 != (ulong *)0x0 &&
         (uVar7 = *puVar5, (uVar7 & 0xf) == 0 && uVar7 != 0)) &&
        ((*(byte *)(uVar7 + 8) & 0x80) == 0)))) {
      uVar7 = *(ulong *)(uVar7 + 0x70);
      if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
        uVar6 = (uint)((long)uVar7 >> 4);
      }
      else {
        uVar6 = (uint)*(undefined8 *)(uVar7 + 0x10);
      }
      if ((uVar6 >> 0xc & 1) != 0) {
        uStack_a0 = puVar5[0xb];
        goto LAB_0014f5aa;
      }
    }
  }
  uStack_a0 = 0;
LAB_0014f5aa:
  if (uStack_a0 == (context->roots).anyValueToVoidPrimitiveName) {
    if (slotCount != 0) {
      sVar9 = 0;
      do {
        uVar7 = *(ulong *)(*arguments + 0x30);
        if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
          sStack_90 = *(sysbvm_tuple_t *)(uVar7 + 0x10 + sVar9 * 8);
        }
        else {
          sStack_90 = 0;
        }
        sysbvm_functionBytecodeDirectCompiler_compileASTNode
                  (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],sStack_90);
        sVar9 = sVar9 + 1;
      } while (slotCount != sVar9);
    }
    sStack_80 = sysbvm_functionBytecodeAssembler_addLiteral
                          (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                           0x2f);
    psVar3 = &sStack_80;
  }
  else if ((uStack_a0 == (context->roots).pointerLikeLoadPrimitiveName) && ((int)slotCount == 1)) {
    uVar7 = *(ulong *)(*arguments + 0x30);
    if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
      sStack_90 = *(sysbvm_tuple_t *)(uVar7 + 0x10);
    }
    else {
      sStack_90 = 0;
    }
    psVar3 = &sStack_80;
    sStack_70 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                          (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],sStack_90
                          );
    sStack_80 = sysbvm_functionBytecodeAssembler_newTemporary
                          (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                           *(sysbvm_tuple_t *)(*arguments + 0x20));
    sysbvm_functionBytecodeAssembler_load
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sStack_80,
               sStack_70);
  }
  else if ((uStack_a0 == (context->roots).pointerLikeStorePrimitiveName) && ((int)slotCount == 2)) {
    uVar7 = *(ulong *)(*arguments + 0x30);
    if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
      sStack_90 = *(sysbvm_tuple_t *)(uVar7 + 0x10);
    }
    else {
      sStack_90 = 0;
    }
    sStack_70 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                          (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],sStack_90
                          );
    uVar7 = *(ulong *)(*arguments + 0x30);
    if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
      sStack_90 = *(sysbvm_tuple_t *)(uVar7 + 0x18);
    }
    else {
      sStack_90 = 0;
    }
    psVar3 = &sStack_70;
    local_68 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                         (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],sStack_90)
    ;
    sysbvm_functionBytecodeAssembler_store
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sStack_70,
               local_68);
  }
  else {
    local_98 = sysbvm_array_create(context,slotCount);
    if (slotCount != 0) {
      sVar9 = 0;
      do {
        uVar7 = *(ulong *)(*arguments + 0x30);
        if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
          sStack_90 = *(sysbvm_tuple_t *)(uVar7 + 0x10 + sVar9 * 8);
        }
        else {
          sStack_90 = 0;
        }
        local_88 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                             (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                              sStack_90);
        if ((local_98 & 0xf) == 0 && local_98 != 0) {
          *(sysbvm_tuple_t *)(local_98 + 0x10 + sVar9 * 8) = local_88;
        }
        sVar9 = sVar9 + 1;
      } while (slotCount != sVar9);
    }
    uVar7 = *(ulong *)(*arguments + 0x20);
    uVar2 = (context->roots).voidType;
    if ((((uVar2 & 0xf) == 0 && uVar2 != 0) && ((uVar7 & 0xf) == 0 && uVar7 != 0)) &&
       (uVar8 = uVar7, (*(byte *)(uVar7 + 8) & 0x80) == 0)) {
      do {
        bVar10 = uVar8 == uVar2;
        if (bVar10) break;
        puVar5 = (ulong *)(uVar8 + 0x30);
        uVar8 = *puVar5;
      } while (*puVar5 != 0);
    }
    else {
      bVar10 = false;
    }
    uVar2 = (context->roots).controlFlowEscapeType;
    if ((((uVar2 & 0xf) == 0 && uVar2 != 0) && ((uVar7 & 0xf) == 0 && uVar7 != 0)) &&
       (uVar8 = uVar7, (*(byte *)(uVar7 + 8) & 0x80) == 0)) {
      do {
        bVar11 = uVar8 == uVar2;
        if (bVar11) break;
        puVar5 = (ulong *)(uVar8 + 0x30);
        uVar8 = *puVar5;
      } while (*puVar5 != 0);
    }
    else {
      bVar11 = false;
    }
    if (bVar10) {
      local_78 = 0;
      sStack_80 = sysbvm_functionBytecodeAssembler_addLiteral
                            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                             0x2f);
    }
    else {
      sStack_80 = sysbvm_functionBytecodeAssembler_newTemporary
                            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                             uVar7);
      local_78 = sStack_80;
    }
    uVar7 = *(ulong *)(*arguments + 0x38);
    if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
      uVar7 = (long)uVar7 >> 4;
    }
    else {
      uVar7 = *(ulong *)(uVar7 + 0x10);
    }
    if ((uVar7 & 1) == 0) {
      sysbvm_functionBytecodeAssembler_call
                (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_78,
                 (sysbvm_tuple_t)local_a8,local_98);
    }
    else {
      sysbvm_functionBytecodeAssembler_uncheckedCall
                (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_78,
                 (sysbvm_tuple_t)local_a8,local_98);
    }
    psVar3 = &sStack_80;
    if (bVar11) {
      sysbvm_functionBytecodeAssembler_unreachable
                (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10));
    }
  }
  sysbvm_stackFrame_popRecord(&local_58);
  return *psVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_astFunctionApplicationNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astFunctionApplicationNode_t **applicationNode = (sysbvm_astFunctionApplicationNode_t**)node;
    struct {
        sysbvm_tuple_t function;
        sysbvm_tuple_t primitiveName;
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argumentOperand;
        sysbvm_tuple_t result;
        sysbvm_tuple_t resultTemporary;

        sysbvm_tuple_t pointerOperand;
        sysbvm_tuple_t valueOperand;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t applicationArgumentCount = sysbvm_array_getSize((*applicationNode)->arguments);

    gcFrame.function = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*applicationNode)->functionExpression);

    // Inline some special functions here.
    gcFrame.primitiveName = sysbvm_functionBytecodeAssembler_getLiteralFunctionPrimitiveName(context, (*compiler)->assembler, gcFrame.function);
    if(gcFrame.primitiveName == context->roots.anyValueToVoidPrimitiveName)
    {
        for(size_t i = 0; i < applicationArgumentCount; ++i)
        {
            gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
            sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);
        }

        gcFrame.result = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }
    else if(gcFrame.primitiveName == context->roots.pointerLikeLoadPrimitiveName && applicationArgumentCount == 1)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, 0);
        gcFrame.pointerOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);

        gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*applicationNode)->super.analyzedType);
        sysbvm_functionBytecodeAssembler_load(context, (*compiler)->assembler, gcFrame.result, gcFrame.pointerOperand);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }
    else if(gcFrame.primitiveName == context->roots.pointerLikeStorePrimitiveName && applicationArgumentCount == 2)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, 0);
        gcFrame.pointerOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);

        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, 1);
        gcFrame.valueOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);

        sysbvm_functionBytecodeAssembler_store(context, (*compiler)->assembler, gcFrame.pointerOperand, gcFrame.valueOperand);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.pointerOperand;
    }

    gcFrame.arguments = sysbvm_array_create(context, applicationArgumentCount);

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
        gcFrame.argumentOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);
        sysbvm_array_atPut(gcFrame.arguments, i, gcFrame.argumentOperand);
    }

    bool isVoidType = sysbvm_type_isDirectSubtypeOf((*applicationNode)->super.analyzedType, context->roots.voidType);
    bool isControlFlowEscape = sysbvm_type_isDirectSubtypeOf((*applicationNode)->super.analyzedType, context->roots.controlFlowEscapeType);
    if(isVoidType)
    {
        gcFrame.resultTemporary = SYSBVM_NULL_TUPLE;
        gcFrame.result = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
    }
    else
    {
        gcFrame.resultTemporary = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*applicationNode)->super.analyzedType);
        gcFrame.result = gcFrame.resultTemporary;
    }

    sysbvm_bitflags_t applicationFlags = sysbvm_tuple_bitflags_decode((*applicationNode)->applicationFlags);
    bool isNotypecheck = (applicationFlags & SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK) != 0;

    if(isNotypecheck)
        sysbvm_functionBytecodeAssembler_uncheckedCall(context, (*compiler)->assembler, gcFrame.resultTemporary, gcFrame.function, gcFrame.arguments);
    else
        sysbvm_functionBytecodeAssembler_call(context, (*compiler)->assembler, gcFrame.resultTemporary, gcFrame.function, gcFrame.arguments);

    if(isControlFlowEscape)
        sysbvm_functionBytecodeAssembler_unreachable(context, (*compiler)->assembler);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}